

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

ssize_t __thiscall SpanReader::read(SpanReader *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t *psVar1;
  long lVar2;
  char *pcVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (__buf != (void *)0x0) {
    if ((void *)(this->m_data).m_size < __buf) {
      pcVar3 = (char *)__cxa_allocate_exception(0x20);
      std::iostream_category();
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar3,(error_code *)"SpanReader::read(): end of data");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_003219a1;
    }
    memcpy((void *)CONCAT44(in_register_00000034,__fd),(this->m_data).m_data,(size_t)__buf);
    (this->m_data).m_data = (this->m_data).m_data + (long)__buf;
    psVar1 = &(this->m_data).m_size;
    *psVar1 = *psVar1 - (long)__buf;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
LAB_003219a1:
  __stack_chk_fail();
}

Assistant:

void read(Span<std::byte> dst)
    {
        if (dst.size() == 0) {
            return;
        }

        // Read from the beginning of the buffer
        if (dst.size() > m_data.size()) {
            throw std::ios_base::failure("SpanReader::read(): end of data");
        }
        memcpy(dst.data(), m_data.data(), dst.size());
        m_data = m_data.subspan(dst.size());
    }